

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O2

string * __thiscall
DragonParser::LexerNamespace::Num::to_string_abi_cxx11_(string *__return_storage_ptr__,Num *this)

{
  std::__cxx11::to_string(__return_storage_ptr__,*(int *)&(this->super_Token).field_0xc);
  return __return_storage_ptr__;
}

Assistant:

string Num::to_string() const
    {
        return std::to_string(value);
    }